

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O0

void P_TranslateLineDef(line_t *ld,maplinedef_t *mld,int lineindexforid)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int local_94;
  byte local_8d;
  int k;
  bool found;
  BYTE val;
  int *piStack_88;
  int flagtemp;
  int *destp;
  FBoomArg *arg_1;
  FBoomTranslator *pFStack_70;
  uint j;
  FBoomTranslator *b;
  int *piStack_60;
  int i_2;
  int *xnode;
  int argop;
  int arg;
  int t;
  FXlatExprState state;
  FLineTrans *linetrans;
  int i_1;
  int i;
  DWORD newflags;
  DWORD flags1;
  INTBOOL passthrough;
  DWORD flags;
  short tag;
  unsigned_short special;
  int lineindexforid_local;
  maplinedef_t *mld_local;
  line_t *ld_local;
  
  uVar1 = mld->special;
  sVar2 = mld->tag;
  bVar3 = false;
  i_1 = 0;
  i = (uint)mld->flags;
  for (linetrans._4_4_ = 0; linetrans._4_4_ < 0x10; linetrans._4_4_ = linetrans._4_4_ + 1) {
    if ((((uint)mld->flags & 1 << ((byte)linetrans._4_4_ & 0x1f)) != 0) &&
       ((LineFlagTranslations[linetrans._4_4_].ismask & 1U) != 0)) {
      i = LineFlagTranslations[linetrans._4_4_].newvalue & i;
    }
  }
  for (linetrans._0_4_ = 0; (int)linetrans < 0x10; linetrans._0_4_ = (int)linetrans + 1) {
    if (((i & 1 << ((byte)(int)linetrans & 0x1f)) != 0) &&
       ((LineFlagTranslations[(int)linetrans].ismask & 1U) == 0)) {
      iVar5 = LineFlagTranslations[(int)linetrans].newvalue;
      if (iVar5 == -3) {
        ld->alpha = 0.25;
      }
      else if (iVar5 == -2) {
        ld->alpha = 0.75;
      }
      else if (iVar5 == -1) {
        bVar3 = true;
      }
      else {
        i_1 = LineFlagTranslations[(int)linetrans].newvalue | i_1;
      }
    }
  }
  flags1 = i_1;
  if (-1 < lineindexforid) {
    FTagManager::AddLineID(&tagManager,lineindexforid,(int)sVar2);
  }
  if (uVar1 == 0) {
    ld->special = 0;
    ld->flags = i_1;
    ld->args[0] = (int)mld->tag;
    memset(ld->args + 1,0,0x10);
  }
  else {
    state.tag = 0;
    state.bIsConstant = false;
    state._9_3_ = 0;
    uVar4 = TArray<FLineTrans,_FLineTrans>::Size
                      (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>);
    if (uVar1 < uVar4) {
      state._4_8_ = TArray<FLineTrans,_FLineTrans>::operator[]
                              (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,
                               (ulong)uVar1);
    }
    if ((state._4_8_ == 0) || (*(int *)state._4_8_ == 0)) {
      for (b._4_4_ = 0; b._4_4_ < NumBoomish; b._4_4_ = b._4_4_ + 1) {
        lVar7 = (long)b._4_4_;
        pFStack_70 = Boomish + lVar7;
        if ((pFStack_70->FirstLinetype <= uVar1) && (uVar1 <= Boomish[lVar7].LastLinetype)) {
          ld->special = (uint)Boomish[lVar7].NewSpecial;
          switch(uVar1 & 7) {
          case 1:
            flags1 = i_1 | 0x200;
          case 0:
            ld->activation = 1;
            break;
          case 3:
          case 7:
            flags1 = i_1 | 0x200;
          case 2:
          case 6:
            if (bVar3) {
              ld->activation = 0x40;
            }
            else {
              ld->activation = 2;
            }
            break;
          case 5:
            flags1 = i_1 | 0x200;
          case 4:
            ld->activation = 8;
          }
          ld->args[0] = (int)sVar2;
          ld->args[4] = 0;
          ld->args[3] = 0;
          ld->args[2] = 0;
          ld->args[1] = 0;
          for (arg_1._4_4_ = 0; uVar4 = arg_1._4_4_,
              uVar6 = TArray<FBoomArg,_FBoomArg>::Size(&pFStack_70->Args), uVar4 < uVar6;
              arg_1._4_4_ = arg_1._4_4_ + 1) {
            destp = (int *)TArray<FBoomArg,_FBoomArg>::operator[]
                                     (&pFStack_70->Args,(ulong)arg_1._4_4_);
            local_8d = 0;
            if (((FBoomArg *)destp)->ArgNum < 4) {
              piStack_88 = ld->args + (int)(((FBoomArg *)destp)->ArgNum + 1);
            }
            else {
              k = flags1 >> 9 & 0x3f;
              piStack_88 = &k;
            }
            if (((FBoomArg *)destp)->ListSize == '\0') {
              local_8d = ((FBoomArg *)destp)->ConstantValue;
              bVar3 = true;
            }
            else {
              bVar3 = false;
              for (local_94 = 0; local_94 < (int)(uint)((FBoomArg *)destp)->ListSize;
                  local_94 = local_94 + 1) {
                if ((uVar1 & ((FBoomArg *)destp)->AndValue) ==
                    ((FBoomArg *)destp)->ResultFilter[local_94]) {
                  local_8d = ((FBoomArg *)destp)->ResultValue[local_94];
                  bVar3 = true;
                }
              }
            }
            if (bVar3) {
              if ((((FBoomArg *)destp)->bOrExisting & 1U) == 0) {
                *piStack_88 = (uint)local_8d;
              }
              else {
                *piStack_88 = (uint)local_8d | *piStack_88;
              }
              if (*(char *)((long)destp + 3) == '\x04') {
                flags1 = flags1 & 0xffff81ff | k << 9;
              }
            }
          }
          if (((uVar1 & 7) == 7) || ((uVar1 & 7) == 6)) {
            if (ld->special == 0xca) {
              ld->args[2] = ld->args[2] | 0x80;
            }
            else {
              ld->args[0] = 0;
            }
          }
          ld->flags = flags1;
          if ((flags1 & 0x2000) == 0) {
            return;
          }
          if (ld->activation != 1) {
            return;
          }
          ld->activation = 0x80;
          return;
        }
      }
      ld->special = 0;
      ld->flags = i_1;
      memset(ld->args,0,0x14);
    }
    else {
      ld->special = *(int *)state._4_8_;
      ld->flags = i_1 | (*(uint *)(state._4_8_ + 4) & 0x1f) << 9;
      if ((*(uint *)(state._4_8_ + 4) & 0x20) != 0) {
        ld->flags = ld->flags | 0x800000;
      }
      iVar5 = GET_SPAC(ld->flags);
      ld->activation = 1 << ((byte)iVar5 & 0x1f);
      if (ld->activation == 0x80) {
        ld->activation = 0x28;
      }
      else if (ld->activation == 8) {
        ld->activation = 0x28;
      }
      ld->flags = ld->flags & 0xffffe3ff;
      if ((bVar3) && (ld->activation == 2)) {
        ld->activation = 0x40;
      }
      t = (int)sVar2;
      arg = (int)uVar1;
      for (argop = 0; argop < 5; argop = argop + 1) {
        xnode._4_4_ = *(int *)(state._4_8_ + 8 + (long)argop * 4);
        xnode._0_4_ = *(int *)(state._4_8_ + 4) >> ((char)argop * '\x02' + 0x14U & 0x1f) & 3;
        if ((uint)xnode == 0) {
          ld->args[argop] = xnode._4_4_;
        }
        else if ((uint)xnode == 1) {
          ld->args[argop] = (int)sVar2;
        }
        else {
          if ((uint)xnode != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_xlat.cpp"
                          ,0xaa,"void P_TranslateLineDef(line_t *, maplinedef_t *, int)");
          }
          piStack_60 = TArray<int,_int>::operator[](&XlatExpressions,(long)xnode._4_4_);
          state.linetype._0_1_ = 1;
          (*XlatExprEval[*piStack_60])(ld->args + argop,piStack_60,(FXlatExprState *)&arg);
        }
      }
      if (((ld->flags & 0x20) != 0) && ((ld->activation & 0x42) != 0)) {
        ld->flags = ld->flags & 0xffffdfff;
      }
    }
  }
  return;
}

Assistant:

void P_TranslateLineDef (line_t *ld, maplinedef_t *mld, int lineindexforid)
{
	unsigned short special = (unsigned short) LittleShort(mld->special);
	short tag = LittleShort(mld->tag);
	DWORD flags = LittleShort(mld->flags);
	INTBOOL passthrough = 0;

	DWORD flags1 = flags;
	DWORD newflags = 0;

	for(int i=0;i<16;i++)
	{
		if ((flags & (1<<i)) && LineFlagTranslations[i].ismask)
		{
			flags1 &= LineFlagTranslations[i].newvalue;
		}
	}
	for(int i=0;i<16;i++)
	{
		if ((flags1 & (1<<i)) && !LineFlagTranslations[i].ismask)
		{
			switch (LineFlagTranslations[i].newvalue)
			{
			case -1:
				passthrough = true;
				break;
			case -2:
				ld->alpha = 0.75;
				break;
			case -3:
				ld->alpha = 0.25;
				break;
			default:
				newflags |= LineFlagTranslations[i].newvalue;
				break;
			}
		}
	}
	flags = newflags;

	if (lineindexforid >= 0)
	{
		// For purposes of maintaining BOOM compatibility, each
		// line also needs to have its ID set to the same as its tag.
		// An external conversion program would need to do this more
		// intelligently.
		tagManager.AddLineID(lineindexforid, tag);
	}

	// 0 specials are never translated.
	if (special == 0)
	{
		ld->special = 0;
		ld->flags = flags;
		ld->args[0] = mld->tag;
		memset (ld->args+1, 0, sizeof(ld->args)-sizeof(ld->args[0]));
		return;
	}

	FLineTrans *linetrans = NULL;
	if (special < SimpleLineTranslations.Size()) linetrans = &SimpleLineTranslations[special];
	if (linetrans != NULL && linetrans->special != 0)
	{
		ld->special = linetrans->special;

		ld->flags = flags | ((linetrans->flags & 0x1f) << 9);
		if (linetrans->flags & 0x20) ld->flags |= ML_FIRSTSIDEONLY;
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact|SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;

		if (passthrough && ld->activation == SPAC_Use)
		{
			ld->activation = SPAC_UseThrough;
		}
		// Set special arguments.
		FXlatExprState state;
		state.tag = tag;
		state.linetype = special;
		for (int t = 0; t < LINETRANS_MAXARGS; ++t)
		{
			int arg = linetrans->args[t];
			int argop = (linetrans->flags >> (LINETRANS_TAGSHIFT + t*TAGOP_NUMBITS)) & TAGOP_MASK;

			switch (argop)
			{
			case ARGOP_Const:
				ld->args[t] = arg;
				break;
			case ARGOP_Tag:
				ld->args[t] = tag;
				break;
			case ARGOP_Expr:
				{
					int *xnode = &XlatExpressions[arg];
					state.bIsConstant = true;
					XlatExprEval[*xnode](&ld->args[t], xnode, &state);
				}
				break;
			default:
				assert(0);
				ld->args[t] = 0;
				break;
			}
		}

		if ((ld->flags & ML_SECRET) && ld->activation & (SPAC_Use|SPAC_UseThrough))
		{
			ld->flags &= ~ML_MONSTERSCANACTIVATE;
		}
		return;
	}

	for(int i=0;i<NumBoomish;i++)
	{
		FBoomTranslator *b = &Boomish[i];

		if (special >= b->FirstLinetype && special <= b->LastLinetype)
		{
			ld->special = b->NewSpecial;

			switch (special & 0x0007)
			{
			case WalkMany:
				flags |= ML_REPEAT_SPECIAL;
			case WalkOnce:
				ld->activation = SPAC_Cross;
				break;

			case SwitchMany:
			case PushMany:
				flags |= ML_REPEAT_SPECIAL;
			case SwitchOnce:
			case PushOnce:
				if (passthrough)
					ld->activation = SPAC_UseThrough;
				else
					ld->activation = SPAC_Use;
				break;

			case GunMany:
				flags |= ML_REPEAT_SPECIAL;
			case GunOnce:
				ld->activation = SPAC_Impact;
				break;
			}

			ld->args[0] = tag;
			ld->args[1] = ld->args[2] = ld->args[3] = ld->args[4] = 0;

			for(unsigned j=0; j < b->Args.Size(); j++)
			{
				FBoomArg *arg = &b->Args[j];
				int *destp;
				int flagtemp;
				BYTE val = 0;	// quiet, GCC
				bool found;

				if (arg->ArgNum < 4)
				{
					destp = &ld->args[arg->ArgNum+1];
				}
				else
				{
					flagtemp = ((flags >> 9) & 0x3f);
					destp = &flagtemp;
				}
				if (arg->ListSize == 0)
				{
					val = arg->ConstantValue;
					found = true;
				}
				else
				{
					found = false;
					for (int k = 0; k < arg->ListSize; k++)
					{
						if ((special & arg->AndValue) == arg->ResultFilter[k])
						{
							val = arg->ResultValue[k];
							found = true;
						}
					}
				}
				if (found)
				{
					if (arg->bOrExisting)
					{
						*destp |= val;
					}
					else
					{
						*destp = val;
					}
					if (arg->ArgNum == 4)
					{
						flags = (flags & ~0x7e00) | (flagtemp << 9);
					}
				}
			}
			// We treat push triggers like switch triggers with zero tags.
			if ((special & 7) == PushMany || (special & 7) == PushOnce)
			{
				if (ld->special == Generic_Door)
				{
					ld->args[2] |= 128;
				}
				else
				{
					ld->args[0] = 0;
				}
			}
			ld->flags = flags;
			if (flags & ML_MONSTERSCANACTIVATE && ld->activation == SPAC_Cross)
			{
				// In Boom anything can activate such a line so set the proper type here.
				ld->activation = SPAC_AnyCross;
			}
			return;
		}
	}
	// Don't know what to do, so 0 it
	ld->special = 0;
	ld->flags = flags;
	memset (ld->args, 0, sizeof(ld->args));
}